

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

void __thiscall dg::vr::GraphBuilder::buildBlock(GraphBuilder *this,BasicBlock *block)

{
  long lVar1;
  VRLocation *this_00;
  VRLocation *pVVar2;
  sockaddr *__addr;
  socklen_t in_ECX;
  BasicBlock *pBVar3;
  BasicBlock *inst;
  Instruction *inst_00;
  VRLocation *previousLoc;
  GraphBuilder *local_50;
  BasicBlock *local_48;
  BasicBlock *local_40;
  BasicBlock *local_38;
  
  lVar1 = *(long *)(block + 0x30);
  inst_00 = (Instruction *)(lVar1 + -0x18);
  if (lVar1 == 0) {
    inst_00 = (Instruction *)0x0;
  }
  previousLoc = VRCodeGraph::newVRLocation(*(VRCodeGraph **)(this + 8),inst_00);
  pBVar3 = *(BasicBlock **)(lVar1 + 8);
  local_50 = this;
  local_38 = block;
  std::
  _Rb_tree<llvm::BasicBlock_const*,std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>,std::_Select1st<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>,std::less<llvm::BasicBlock_const*>,std::allocator<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>>
  ::_M_emplace_unique<llvm::BasicBlock_const*,dg::vr::VRLocation*&>
            ((_Rb_tree<llvm::BasicBlock_const*,std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>,std::_Select1st<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>,std::less<llvm::BasicBlock_const*>,std::allocator<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>>
              *)(this + 0x10),&local_38,&previousLoc);
  local_40 = block + 0x28;
  local_48 = block;
  for (; pBVar3 != local_40; pBVar3 = *(BasicBlock **)(pBVar3 + 8)) {
    inst = pBVar3 + -0x18;
    if (pBVar3 == (BasicBlock *)0x0) {
      inst = (BasicBlock *)0x0;
    }
    pVVar2 = VRCodeGraph::newVRLocation(*(VRCodeGraph **)(local_50 + 8),(Instruction *)inst);
    this_00 = previousLoc;
    __addr = (sockaddr *)operator_new(0x18);
    __addr->sa_data[6] = '\x01';
    __addr->sa_data[7] = '\0';
    __addr->sa_data[8] = '\0';
    __addr->sa_data[9] = '\0';
    *(undefined ***)__addr = &PTR__VROp_00150d60;
    *(Instruction **)(__addr + 1) = inst_00;
    VRLocation::connect(this_00,(int)pVVar2,__addr,in_ECX);
    inst_00 = (Instruction *)inst;
    previousLoc = pVVar2;
  }
  local_38 = local_48;
  std::
  _Rb_tree<llvm::BasicBlock_const*,std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>,std::_Select1st<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>,std::less<llvm::BasicBlock_const*>,std::allocator<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>>
  ::_M_emplace_unique<llvm::BasicBlock_const*,dg::vr::VRLocation*&>
            ((_Rb_tree<llvm::BasicBlock_const*,std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>,std::_Select1st<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>,std::less<llvm::BasicBlock_const*>,std::allocator<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>>
              *)(local_50 + 0x40),&local_38,&previousLoc);
  return;
}

Assistant:

void GraphBuilder::buildBlock(const llvm::BasicBlock &block) {
    auto it = block.begin();
    const llvm::Instruction *previousInst = &(*it);
    VRLocation *previousLoc = &codeGraph.newVRLocation(previousInst);
    ++it;

    fronts.emplace(&block, previousLoc);

    for (; it != block.end(); ++it) {
        const llvm::Instruction &inst = *it;
        VRLocation &newLoc = codeGraph.newVRLocation(&inst);

        previousLoc->connect(newLoc, new VRInstruction(previousInst));

        previousInst = &inst;
        previousLoc = &newLoc;
    }

    backs.emplace(&block, previousLoc);
}